

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

void __thiscall btQuantizedBvh::buildTree(btQuantizedBvh *this,int startIndex,int endIndex)

{
  int iVar1;
  int endIndex_00;
  int iVar2;
  int iVar3;
  int iVar4;
  btVector3 local_50;
  btVector3 local_40;
  
  iVar3 = this->m_curNodeIndex;
  if (endIndex - startIndex == 1) {
    assignInternalNodeFromLeafNode(this,iVar3,startIndex);
    this->m_curNodeIndex = this->m_curNodeIndex + 1;
  }
  else {
    iVar1 = calcSplittingAxis(this,startIndex,endIndex);
    endIndex_00 = sortAndCalcSplittingIndex(this,startIndex,endIndex,iVar1);
    iVar1 = this->m_curNodeIndex;
    setInternalNodeAabbMin(this,iVar1,&this->m_bvhAabbMax);
    setInternalNodeAabbMax(this,this->m_curNodeIndex,&this->m_bvhAabbMin);
    for (iVar2 = startIndex; iVar4 = this->m_curNodeIndex, iVar2 < endIndex; iVar2 = iVar2 + 1) {
      local_40 = getAabbMin(this,iVar2);
      local_50 = getAabbMax(this,iVar2);
      mergeInternalNodeAabb(this,iVar4,&local_40,&local_50);
    }
    iVar4 = iVar4 + 1;
    this->m_curNodeIndex = iVar4;
    buildTree(this,startIndex,endIndex_00);
    iVar2 = this->m_curNodeIndex;
    buildTree(this,endIndex_00,endIndex);
    iVar3 = this->m_curNodeIndex - iVar3;
    if ((0x80 < iVar3 & this->m_useQuantization) == 1) {
      updateSubtreeHeaders(this,iVar4,iVar2);
    }
    setInternalNodeEscapeIndex(this,iVar1,iVar3);
  }
  return;
}

Assistant:

void	btQuantizedBvh::buildTree	(int startIndex,int endIndex)
{
#ifdef DEBUG_TREE_BUILDING
	gStackDepth++;
	if (gStackDepth > gMaxStackDepth)
		gMaxStackDepth = gStackDepth;
#endif //DEBUG_TREE_BUILDING


	int splitAxis, splitIndex, i;
	int numIndices =endIndex-startIndex;
	int curIndex = m_curNodeIndex;

	btAssert(numIndices>0);

	if (numIndices==1)
	{
#ifdef DEBUG_TREE_BUILDING
		gStackDepth--;
#endif //DEBUG_TREE_BUILDING
		
		assignInternalNodeFromLeafNode(m_curNodeIndex,startIndex);

		m_curNodeIndex++;
		return;	
	}
	//calculate Best Splitting Axis and where to split it. Sort the incoming 'leafNodes' array within range 'startIndex/endIndex'.
	
	splitAxis = calcSplittingAxis(startIndex,endIndex);

	splitIndex = sortAndCalcSplittingIndex(startIndex,endIndex,splitAxis);

	int internalNodeIndex = m_curNodeIndex;
	
	//set the min aabb to 'inf' or a max value, and set the max aabb to a -inf/minimum value.
	//the aabb will be expanded during buildTree/mergeInternalNodeAabb with actual node values
	setInternalNodeAabbMin(m_curNodeIndex,m_bvhAabbMax);//can't use btVector3(SIMD_INFINITY,SIMD_INFINITY,SIMD_INFINITY)) because of quantization
	setInternalNodeAabbMax(m_curNodeIndex,m_bvhAabbMin);//can't use btVector3(-SIMD_INFINITY,-SIMD_INFINITY,-SIMD_INFINITY)) because of quantization
	
	
	for (i=startIndex;i<endIndex;i++)
	{
		mergeInternalNodeAabb(m_curNodeIndex,getAabbMin(i),getAabbMax(i));
	}

	m_curNodeIndex++;
	

	//internalNode->m_escapeIndex;
	
	int leftChildNodexIndex = m_curNodeIndex;

	//build left child tree
	buildTree(startIndex,splitIndex);

	int rightChildNodexIndex = m_curNodeIndex;
	//build right child tree
	buildTree(splitIndex,endIndex);

#ifdef DEBUG_TREE_BUILDING
	gStackDepth--;
#endif //DEBUG_TREE_BUILDING

	int escapeIndex = m_curNodeIndex - curIndex;

	if (m_useQuantization)
	{
		//escapeIndex is the number of nodes of this subtree
		const int sizeQuantizedNode =sizeof(btQuantizedBvhNode);
		const int treeSizeInBytes = escapeIndex * sizeQuantizedNode;
		if (treeSizeInBytes > MAX_SUBTREE_SIZE_IN_BYTES)
		{
			updateSubtreeHeaders(leftChildNodexIndex,rightChildNodexIndex);
		}
	} else
	{

	}

	setInternalNodeEscapeIndex(internalNodeIndex,escapeIndex);

}